

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O1

void __thiscall polyscope::PointCloud::buildPickUI(PointCloud *this,size_t localPickID)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  size_type *psVar8;
  size_t sVar9;
  vec3 *v;
  float fVar10;
  string __str;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  cVar4 = '\x01';
  if (9 < localPickID) {
    sVar9 = localPickID;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (sVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001df754;
      }
      if (sVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001df754;
      }
      if (sVar9 < 10000) goto LAB_001df754;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001df754:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_48,local_40,localPickID);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x2ae919);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar5[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar5;
  }
  local_60 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
  paVar1 = &local_88.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88.field_2._8_8_ = plVar5[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_88._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ImGui::TextUnformatted(local_88._M_dataplus._M_p,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  ImGui::SameLine(0.0,-1.0);
  to_string_abi_cxx11_
            (&local_88,
             (polyscope *)
             ((this->points).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + localPickID),v);
  ImGui::TextUnformatted(local_88._M_dataplus._M_p,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.0);
  ImGui::Columns(2,(char *)0x0,true);
  fVar10 = ImGui::GetWindowWidth();
  ImGui::SetColumnWidth(0,fVar10 / 3.0);
  for (p_Var6 = (this->super_QuantityStructure<polyscope::PointCloud>).quantities._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->super_QuantityStructure<polyscope::PointCloud>).quantities._M_t._M_impl.
       super__Rb_tree_header; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    (**(code **)(**(long **)(p_Var6 + 2) + 0x28))(*(long **)(p_Var6 + 2),localPickID);
  }
  ImGui::Indent(-20.0);
  return;
}

Assistant:

void PointCloud::buildPickUI(size_t localPickID) {

  ImGui::TextUnformatted(("#" + std::to_string(localPickID) + "  ").c_str());
  ImGui::SameLine();
  ImGui::TextUnformatted(to_string(points[localPickID]).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildPickUI(localPickID);
  }

  ImGui::Indent(-20.);
}